

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O3

Diagnostics * __thiscall
slang::analysis::AnalysisManager::getDiagnostics
          (Diagnostics *__return_storage_ptr__,AnalysisManager *this,SourceManager *sourceManager)

{
  size_type sVar1;
  Diagnostics *pDVar2;
  pointer pWVar3;
  pointer __x;
  pointer pDVar4;
  bool _;
  ASTDiagMap diagMap;
  bool local_f1;
  pointer local_f0;
  SourceManager *local_e8;
  Diagnostics *local_e0;
  pointer local_d8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
  local_d0;
  Diagnostic local_a0;
  
  local_e8 = sourceManager;
  local_e0 = __return_storage_ptr__;
  wait(this,this);
  local_d0.arrays.groups_size_index = 0x3f;
  local_d0.arrays.groups_size_mask = 1;
  local_d0.arrays.elements_ = (value_type_pointer)0x0;
  local_d0.arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_d0.size_ctrl.ml = 0;
  local_d0.size_ctrl.size = 0;
  pWVar3 = (this->workerStates).
           super__Vector_base<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d8 = (this->workerStates).
             super__Vector_base<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pWVar3 != local_d8) {
    do {
      sVar1 = (pWVar3->context).diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
              super_SmallVectorBase<slang::Diagnostic>.len;
      local_f0 = pWVar3;
      if (sVar1 != 0) {
        __x = (pWVar3->context).diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
              super_SmallVectorBase<slang::Diagnostic>.data_;
        pDVar4 = __x + sVar1;
        do {
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::vector(&local_a0.args,&__x->args);
          std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>::vector
                    (&local_a0.ranges,&__x->ranges);
          std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::vector
                    (&local_a0.notes,&__x->notes);
          local_a0.symbol = __x->symbol;
          local_a0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload =
               (__x->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload;
          local_a0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._8_8_ =
               *(undefined8 *)
                ((long)&(__x->coalesceCount).super__Optional_base<unsigned_long,_true,_true>.
                        _M_payload.super__Optional_payload_base<unsigned_long> + 8);
          local_a0.code = __x->code;
          local_a0._92_4_ = *(undefined4 *)&__x->field_0x5c;
          local_a0.location = __x->location;
          ast::ASTDiagMap::add((ASTDiagMap *)&local_d0,&local_a0,&local_f1);
          std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector
                    (&local_a0.notes);
          if (local_a0.ranges.
              super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.ranges.
                            super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_a0.ranges.
                                  super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a0.ranges.
                                  super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::~vector(&local_a0.args);
          __x = __x + 1;
        } while (__x != pDVar4);
      }
      pWVar3 = local_f0 + 1;
    } while (pWVar3 != local_d8);
  }
  pDVar2 = local_e0;
  ast::ASTDiagMap::coalesce(local_e0,(ASTDiagMap *)&local_d0,local_e8);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
  ::~table_core(&local_d0);
  return pDVar2;
}

Assistant:

Diagnostics AnalysisManager::getDiagnostics(const SourceManager* sourceManager) {
    wait();

    ASTDiagMap diagMap;
    for (auto& state : workerStates) {
        for (auto& diag : state.context.diagnostics) {
            bool _;
            diagMap.add(diag, _);
        }
    }

    return diagMap.coalesce(sourceManager);
}